

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

GetWitnessStackNumResponseStruct *
cfd::js::api::ElementsTransactionStructApi::GetWitnessStackNum
          (GetWitnessStackNumResponseStruct *__return_storage_ptr__,
          GetWitnessStackNumRequestStruct *request)

{
  string *in_R8;
  allocator local_109;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  function<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&)>
  local_e0;
  GetWitnessStackNumResponseStruct local_c0;
  
  GetWitnessStackNumResponseStruct::GetWitnessStackNumResponseStruct(__return_storage_ptr__);
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:759:20)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<cfd::js::api::GetWitnessStackNumResponseStruct_(const_cfd::js::api::GetWitnessStackNumRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:759:20)>
             ::_M_manager;
  std::__cxx11::string::string((string *)&local_e0,"GetWitnessStackNum",&local_109);
  ExecuteStructApi<cfd::js::api::GetWitnessStackNumRequestStruct,cfd::js::api::GetWitnessStackNumResponseStruct>
            (&local_c0,(api *)request,(GetWitnessStackNumRequestStruct *)&local_108,&local_e0,in_R8)
  ;
  GetWitnessStackNumResponseStruct::operator=(__return_storage_ptr__,&local_c0);
  GetWitnessStackNumResponseStruct::~GetWitnessStackNumResponseStruct(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

GetWitnessStackNumResponseStruct
ElementsTransactionStructApi::GetWitnessStackNum(
    const GetWitnessStackNumRequestStruct& request) {
  auto call_func = [](const GetWitnessStackNumRequestStruct& request)
      -> GetWitnessStackNumResponseStruct {  // NOLINT
    GetWitnessStackNumResponseStruct response;

    ElementsTransactionApi api;
    uint32_t count = api.GetWitnessStackNum(
        request.tx, Txid(request.txin.txid), request.txin.vout);

    response.count = count;
    return response;
  };

  GetWitnessStackNumResponseStruct result;
  result = ExecuteStructApi<
      GetWitnessStackNumRequestStruct, GetWitnessStackNumResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}